

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_hash.c
# Opt level: O0

adt_hkey_t * adt_hnode_find(adt_hnode_t *node,char *key,uint32_t u32Hash)

{
  int iVar1;
  bool bVar2;
  adt_hkey_t *local_38;
  adt_hkey_t *hkey;
  int i;
  uint8_t u8Bucket;
  uint32_t u32Hash_local;
  char *key_local;
  adt_hnode_t *node_local;
  
  if (node->u8Width == '\x10') {
    node_local = (adt_hnode_t *)
                 adt_hnode_find((adt_hnode_t *)
                                ((node->child).match +
                                ((byte)(u32Hash >> ((node->u8Depth & 7) << 2)) & 0xf)),key,u32Hash);
  }
  else {
    for (hkey._4_4_ = 0; hkey._4_4_ < (int)(uint)node->u8Cur; hkey._4_4_ = hkey._4_4_ + 1) {
      if ((node->child).match[hkey._4_4_].u32Hash == u32Hash) {
        local_38 = (node->child).match[hkey._4_4_].key;
        while( true ) {
          bVar2 = false;
          if (local_38 != (adt_hkey_t *)0x0) {
            iVar1 = strcmp(local_38->key,key);
            bVar2 = iVar1 != 0;
          }
          if (!bVar2) break;
          local_38 = local_38->next;
        }
        return local_38;
      }
    }
    node_local = (adt_hnode_t *)0x0;
  }
  return (adt_hkey_t *)node_local;
}

Assistant:

adt_hkey_t * adt_hnode_find(const adt_hnode_t *node, const char *key,uint32_t u32Hash){
	if(node->u8Width == 16){
			uint8_t u8Bucket = (uint8_t) ( (u32Hash >> (node->u8Depth*4)) & 0xF);
			return adt_hnode_find(&node->child.node[u8Bucket],key,u32Hash);
	}
	else{
		int i;
		for(i=0;i<node->u8Cur;i++){
			if(node->child.match[i].u32Hash == u32Hash){
				adt_hkey_t *hkey = node->child.match[i].key;
				while( (hkey) && (strcmp(hkey->key,key)!=0) ){
					hkey = hkey->next;
				}
				return hkey;
			}
		}
	}
	return 0;
}